

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2.c
# Opt level: O2

MPP_RET iep2_done(iep2_api_ctx *ctx)

{
  MPP_RET MVar1;
  mv_list ls;
  
  if (((byte)iep_debug & 2) != 0) {
    _mpp_log_l(4,(char *)0x0,"iep:deinterlace detect osd cnt %d, combo %d\n",(char *)0x0,
               (ulong)(ctx->output).dect_osd_cnt,(ulong)(ctx->output).out_osd_comb_cnt);
  }
  MVar1 = (ctx->params).dil_mode;
  if ((uint)(MVar1 + MPP_NOK) < 3) {
    ls.vld[4] = 0;
    ls.vld[5] = 0;
    ls.vld[6] = 0;
    ls.vld[7] = 0;
    ls.vld[0] = 0;
    ls.vld[1] = 0;
    ls.vld[2] = 0;
    ls.vld[3] = 0;
    ls.mv[4] = 0;
    ls.mv[5] = 0;
    ls.mv[6] = 0;
    ls.mv[7] = 0;
    ls.mv[0] = 0;
    ls.mv[1] = 0;
    ls.mv[2] = 0;
    ls.mv[3] = 0;
    ls.idx = 0;
    iep2_update_gmv(ctx,&ls);
    iep2_check_ffo(ctx);
    iep2_check_pd(ctx);
    get_param_from_env(ctx);
    MVar1 = (ctx->params).dil_mode;
  }
  if ((MVar1 == 9) || (MVar1 == ~MPP_ERR_TIMEOUT)) {
    iep2_check_ffo(ctx);
    iep2_check_pd(ctx);
    MVar1 = get_param_from_env(ctx);
  }
  if ((ctx->pd_inf).pdtype != 4) {
    (ctx->params).dil_mode = 7;
    MVar1 = iep2_pd_get_output(&ctx->pd_inf);
    (ctx->params).pd_mode = MVar1;
  }
  return MVar1;
}

Assistant:

static MPP_RET iep2_done(struct iep2_api_ctx *ctx)
{
    iep_dbg_trace("deinterlace detect osd cnt %d, combo %d\n",
                  ctx->output.dect_osd_cnt,
                  ctx->output.out_osd_comb_cnt);

    if (ctx->params.dil_mode == IEP2_DIL_MODE_I5O2 ||
        ctx->params.dil_mode == IEP2_DIL_MODE_I5O1T ||
        ctx->params.dil_mode == IEP2_DIL_MODE_I5O1B) {
        struct mv_list ls;

#if IEP2_OSD_EN
        iep2_set_osd(ctx, &ls);
#else
        memset(&ls, 0, sizeof(struct mv_list));
#endif
        iep2_update_gmv(ctx, &ls);
        iep2_check_ffo(ctx);
        iep2_check_pd(ctx);
        get_param_from_env(ctx);
#if 0
        if (ctx->params.roi_en && ctx->params.osd_area_num > 0) {
            struct iep2_rect r;

            ctx->params.roi_layer_num = 0;

            r.x = 0;
            r.y = 0;
            r.w = ctx->params.tile_cols;
            r.h = ctx->params.tile_rows;
            iep2_set_roi(ctx, &r, ROI_MODE_MA);

            r.x = ctx->params.osd_x_sta[0];
            r.y = ctx->params.osd_y_sta[0];
            r.w = ctx->params.osd_x_end[0] - ctx->params.osd_x_sta[0];
            r.h = ctx->params.osd_y_end[0] - ctx->params.osd_y_sta[0];
            iep2_set_roi(ctx, &r, ROI_MODE_MA_MC);
        }
#endif
    }

    if (ctx->params.dil_mode == IEP2_DIL_MODE_DECT ||
        ctx->params.dil_mode == IEP2_DIL_MODE_PD) {
        iep2_check_ffo(ctx);
        iep2_check_pd(ctx);
        get_param_from_env(ctx);
    }

    if (ctx->pd_inf.pdtype != PD_TYPES_UNKNOWN) {
        ctx->params.dil_mode = IEP2_DIL_MODE_PD;
        ctx->params.pd_mode = iep2_pd_get_output(&ctx->pd_inf);
    } else {
        // TODO, revise others mode replace by I5O2
        //ctx->params.dil_mode = IEP2_DIL_MODE_I5O2;
    }

    return 0;
}